

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O1

void __thiscall fp::Algorithm::~Algorithm(Algorithm *this)

{
  _Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  *psVar3;
  long lVar4;
  
  psVar3 = &(this->node_master_)._M_elems[0xf]._M_elems[0xf].child_node_;
  lVar4 = 0xc4d0;
  do {
    lVar2 = 0;
    do {
      p_Var1 = (_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
               ((long)&(psVar3->c).
                       super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl.super__Deque_impl_data._M_map + lVar2);
      lVar2 = lVar2 + -0x60;
      std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Deque_base
                (p_Var1);
    } while (lVar2 != -0x600);
    lVar4 = lVar4 + -0x600;
    psVar3 = (stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
              *)((long)(psVar3 + -0x14) + 0x40);
  } while (lVar4 != 0x64d0);
  psVar3 = &(this->node_info)._M_elems[0xf]._M_elems[0xf].child_node_;
  lVar4 = 0x64d0;
  do {
    lVar2 = 0;
    do {
      p_Var1 = (_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
               ((long)&(psVar3->c).
                       super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl.super__Deque_impl_data._M_map + lVar2);
      lVar2 = lVar2 + -0x60;
      std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Deque_base
                (p_Var1);
    } while (lVar2 != -0x600);
    lVar4 = lVar4 + -0x600;
    psVar3 = (stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
              *)((long)(psVar3 + -0x14) + 0x40);
  } while (lVar4 != 0x4d0);
  std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Deque_base
            ((_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             &this->path_stack_);
  this_00 = (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Deque_base
            ((_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             &this->stack_);
  return;
}

Assistant:

~Algorithm() = default;